

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

Expression __thiscall
cnn::SimpleRNNBuilder::add_input_impl(SimpleRNNBuilder *this,int prev,Expression *in)

{
  size_type sVar1;
  reference pvVar2;
  int in_EDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x;
  Expression EVar3;
  Expression y;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *vars;
  uint i;
  Expression x;
  uint t;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffe28;
  Expression *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_fffffffffffffe50;
  expr local_178 [16];
  undefined1 local_168 [16];
  Expression aEStack_158 [2];
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_118 [48];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_c8 [48];
  undefined1 *local_98;
  undefined8 local_90;
  reference local_78;
  uint local_6c;
  uint local_24;
  int local_14;
  
  local_14 = in_EDX;
  sVar1 = std::
          vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ::size((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  *)(in_RSI + 0x58));
  local_24 = (uint)sVar1;
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x6b984a);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffe40);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x6b9891);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
  for (local_6c = 0; local_6c < *(uint *)(in_RSI + 0x88); local_6c = local_6c + 1) {
    local_78 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_6c);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,2);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,0);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
    local_98 = local_c8;
    local_90 = 3;
    cnn::expr::affine_transform(in_stack_fffffffffffffe28);
    __x = extraout_XMM0_Qa;
    if ((local_14 == -1) &&
       (sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                          ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                           (in_RSI + 0x70)), __x = extraout_XMM0_Qa_00, sVar1 != 0)) {
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_78,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 (in_RSI + 0x70),(ulong)local_6c);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      local_e8 = local_118;
      local_e0 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffe28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      __x = extraout_XMM0_Qa_01;
    }
    else if (-1 < local_14) {
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe30 = aEStack_158;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_78,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      pvVar2 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x58),(long)local_14);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar2,(ulong)local_6c);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      local_138 = local_168;
      local_130 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffe28);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
      __x = extraout_XMM0_Qa_02;
    }
    cnn::expr::tanh(local_178,__x);
    pvVar2 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           *)(in_RSI + 0x58),(ulong)local_24);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (pvVar2,(ulong)local_6c);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                *)(in_RSI + 0x58),(ulong)local_24);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffe30);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffe30,(Expression *)in_stack_fffffffffffffe28);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = in_RDI;
  return EVar3;
}

Assistant:

Expression SimpleRNNBuilder::add_input_impl(int prev, const Expression &in) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];

    // y <--- f(x)
    Expression y = affine_transform({vars[2], vars[0], x});

    // y <--- g(y_prev)
    if (prev == -1 && h0.size() > 0)
      y = affine_transform({y, vars[1], h0[i]});
    else if (prev >= 0)
      y = affine_transform({y, vars[1], h[prev][i]});

    // x <--- tanh(y)
    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}